

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O1

void __thiscall
bloom_tests::merkle_block_3_and_serialize::test_method(merkle_block_3_and_serialize *this)

{
  uchar *puVar1;
  uint256 *puVar2;
  void *pvVar3;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  left_end;
  iterator in_R8;
  iterator pvVar4;
  uint *args_3;
  iterator in_R9;
  iterator pvVar5;
  uint *args_4;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Span<const_std::byte> sp;
  Span<const_unsigned_char> vKey;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vMatched;
  DataStream stream;
  CBloomFilter filter;
  array<std::byte,_119UL> expected;
  CMerkleBlock merkleBlock;
  CBlock block;
  check_type cVar16;
  char *local_468;
  char *local_460;
  equal_coll_impl local_451;
  assertion_result local_450;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_388;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  assertion_result local_2c8;
  char *local_2b0;
  assertion_result local_2a8;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  DataStream local_270;
  CBloomFilter local_250;
  undefined1 local_228 [16];
  undefined1 local_218 [9];
  uchar uStack_20f;
  uchar uStack_20e;
  uchar uStack_20d;
  uchar uStack_20c;
  uchar uStack_20b;
  uchar uStack_20a;
  uchar uStack_209;
  byte local_1b1 [9];
  undefined1 local_1a8 [8];
  bool bStack_1a0;
  uchar uStack_19f;
  uchar uStack_19e;
  uchar uStack_19d;
  uchar uStack_19c;
  uchar uStack_19b;
  uchar uStack_19a;
  uchar uStack_199;
  shared_count local_198;
  uchar uStack_190;
  uchar uStack_18f;
  uchar uStack_18e;
  uchar uStack_18d;
  uchar uStack_18c;
  uchar uStack_18b;
  uchar uStack_18a;
  uchar uStack_189;
  undefined1 local_188 [8];
  undefined8 uStack_180;
  uchar local_178 [20];
  uint256 local_164;
  uint local_144;
  uint local_140;
  uint local_13c;
  CPartialMerkleTree local_138;
  pointer local_e8;
  pointer local_e0;
  pointer local_d8;
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  pointer local_48;
  undefined3 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (pointer)0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_a8._16_16_ = (undefined1  [16])0x0;
  local_a8._0_16_ = (undefined1  [16])0x0;
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  uStack_40._2_1_ = false;
  memcpy(local_188,
         _ZTAXtlN4util12hex_literals6detail3HexILm433EEEtlSt5arrayISt4byteLm216EEtlA216_S5_LS5_1ELS5_0ELS5_0ELS5_0ELS5_121ELS5_205ELS5_168ELS5_86ELS5_177ELS5_67ELS5_217ELS5_219ELS5_44ELS5_28ELS5_175ELS5_240ELS5_29ELS5_26ELS5_236ELS5_200ELS5_99ELS5_13ELS5_48ELS5_98ELS5_93ELS5_16ELS5_232ELS5_180ELS5_184ELS5_176ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_181ELS5_12ELS5_192ELS5_105ELS5_214ELS5_163ELS5_227ELS5_62ELS5_63ELS5_248ELS5_74ELS5_92ELS5_65ELS5_217ELS5_211ELS5_254ELS5_190ELS5_124ELS5_119ELS5_15ELS5_220ELS5_201ELS5_107ELS5_44ELS5_63ELS5_246ELS5_10ELS5_190ELS5_24ELS5_79ELS5_25ELS5_99ELS5_103ELS5_41ELS5_27ELS5_77ELS5_76ELS5_134ELS5_4ELS5_27ELS5_143ELS5_164ELS5_93ELS5_99ELS5_1ELS5_1ELS5_0ELS5_0ELS5_0ELS5_1ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_255ELS5_255ELS5_255ELS5_255ELS5_8ELS5_4ELS5_76ELS5_134ELS5_4ELS5_27ELS5_2ELS5_10ELS5_2ELS5_255ELS5_255ELS5_255ELS5_255ELS5_1ELS5_0ELS5_242ELS5_5ELS5_42ELS5_1ELS5_0ELS5_0ELS5_0ELS5_67ELS5_65ELS5_4ELS5_236ELS5_211ELS5_34ELS5_155ELS5_5ELS5_113ELS5_195ELS5_190ELS5_135ELS5_111ELS5_234ELS5_172ELS5_4ELS5_66ELS5_169ELS5_241ELS5_60ELS5_90ELS5_87ELS5_39ELS5_66ELS5_146ELS5_122ELS5_241ELS5_220ELS5_98ELS5_51ELS5_83ELS5_236ELS5_248ELS5_194ELS5_2ELS5_34ELS5_95ELS5_100ELS5_134ELS5_129ELS5_55ELS5_161ELS5_140ELS5_221ELS5_133ELS5_203ELS5_187ELS5_76ELS5_116ELS5_251ELS5_204ELS5_253ELS5_79ELS5_73ELS5_99ELS5_156ELS5_241ELS5_189ELS5_201ELS5_74ELS5_86ELS5_114ELS5_187ELS5_21ELS5_173ELS5_93ELS5_76ELS5_172EEEEE
         ,0xd8);
  sp.m_size = 0xd8;
  sp.m_data = local_188;
  DataStream::DataStream(&local_270,sp);
  local_188 = (undefined1  [8])&::TX_WITH_WITNESS;
  uStack_180 = &local_270;
  CBlock::SerializationOps<ParamsStream<DataStream&,TransactionSerParams>,CBlock,ActionUnserialize>
            (local_a8);
  CBloomFilter::CBloomFilter(&local_250,10,1e-06,0,'\x01');
  local_188._0_4_ = 0x69c00cb5;
  local_188[4] = 0xd6;
  local_188[5] = 0xa3;
  local_188[6] = 0xe3;
  local_188[7] = '>';
  uStack_180._0_1_ = '?';
  uStack_180._1_1_ = 0xf8;
  uStack_180._2_1_ = 'J';
  uStack_180._3_1_ = '\\';
  uStack_180._4_1_ = 'A';
  uStack_180._5_1_ = 0xd9;
  uStack_180._6_1_ = 0xd3;
  uStack_180._7_1_ = 0xfe;
  local_178[0] = 0xbe;
  local_178[1] = '|';
  local_178[2] = 'w';
  local_178[3] = '\x0f';
  local_178[4] = 0xdc;
  local_178[5] = 0xc9;
  local_178[6] = 'k';
  local_178[7] = ',';
  local_178[8] = '?';
  local_178[9] = 0xf6;
  local_178[10] = '\n';
  local_178[0xb] = 0xbe;
  local_178[0xc] = '\x18';
  local_178[0xd] = 'O';
  local_178[0xe] = '\x19';
  local_178[0xf] = 'c';
  vKey.m_size = 0x20;
  vKey.m_data = local_188;
  CBloomFilter::insert(&local_250,vKey);
  CMerkleBlock::CMerkleBlock
            ((CMerkleBlock *)local_188,(CBlock *)local_a8,&local_250,
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)0x0);
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x154;
  file.m_begin = (iterator)&local_280;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_290,msg);
  CBlockHeader::GetHash((uint256 *)local_228,(CBlockHeader *)local_188);
  CBlockHeader::GetHash((uint256 *)local_1a8,(CBlockHeader *)local_a8);
  auVar13[0] = -((uchar)local_198.pi_ == local_218[0]);
  auVar13[1] = -(local_198.pi_._1_1_ == local_218[1]);
  auVar13[2] = -(local_198.pi_._2_1_ == local_218[2]);
  auVar13[3] = -(local_198.pi_._3_1_ == local_218[3]);
  auVar13[4] = -(local_198.pi_._4_1_ == local_218[4]);
  auVar13[5] = -(local_198.pi_._5_1_ == local_218[5]);
  auVar13[6] = -(local_198.pi_._6_1_ == local_218[6]);
  auVar13[7] = -(local_198.pi_._7_1_ == local_218[7]);
  auVar13[8] = -(uStack_190 == local_218[8]);
  auVar13[9] = -(uStack_18f == uStack_20f);
  auVar13[10] = -(uStack_18e == uStack_20e);
  auVar13[0xb] = -(uStack_18d == uStack_20d);
  auVar13[0xc] = -(uStack_18c == uStack_20c);
  auVar13[0xd] = -(uStack_18b == uStack_20b);
  auVar13[0xe] = -(uStack_18a == uStack_20a);
  auVar13[0xf] = -(uStack_189 == uStack_209);
  auVar10[0] = -(local_1a8[0] == local_228[0]);
  auVar10[1] = -(local_1a8[1] == local_228[1]);
  auVar10[2] = -(local_1a8[2] == local_228[2]);
  auVar10[3] = -(local_1a8[3] == local_228[3]);
  auVar10[4] = -(local_1a8[4] == local_228[4]);
  auVar10[5] = -(local_1a8[5] == local_228[5]);
  auVar10[6] = -(local_1a8[6] == local_228[6]);
  auVar10[7] = -(local_1a8[7] == local_228[7]);
  auVar10[8] = -(bStack_1a0 == (bool)local_228[8]);
  auVar10[9] = -(uStack_19f == local_228[9]);
  auVar10[10] = -(uStack_19e == local_228[10]);
  auVar10[0xb] = -(uStack_19d == local_228[0xb]);
  auVar10[0xc] = -(uStack_19c == local_228[0xc]);
  auVar10[0xd] = -(uStack_19b == local_228[0xd]);
  auVar10[0xe] = -(uStack_19a == local_228[0xe]);
  auVar10[0xf] = -(uStack_199 == local_228[0xf]);
  auVar10 = auVar10 & auVar13;
  local_2a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff);
  local_2a8.m_message.px = (element_type *)0x0;
  local_2a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2b0 = (char *)&local_388;
  local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)"";
  local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)"merkleBlock.header.GetHash() == block.GetHash()";
  local_2c8.m_message.px = (element_type *)(local_2c8.m_message._1_8_ << 8);
  local_2c8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2d0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a8,(lazy_ostream *)&local_2c8,1,0,WARN,_cVar16,(size_t)&local_2d8,0x154);
  boost::detail::shared_count::~shared_count(&local_2a8.m_message.pn);
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x156;
  file_00.m_begin = (iterator)&local_2e8;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2f8,
             msg_00);
  local_1a8[0] = (class_property<bool>)((long)local_e0 - (long)local_e8 == 0x24);
  bStack_1a0 = false;
  uStack_19f = '\0';
  uStack_19e = '\0';
  uStack_19d = '\0';
  uStack_19c = '\0';
  uStack_19b = '\0';
  uStack_19a = '\0';
  uStack_199 = '\0';
  local_198.pi_._0_1_ = '\0';
  local_198.pi_._1_1_ = '\0';
  local_198.pi_._2_1_ = '\0';
  local_198.pi_._3_1_ = '\0';
  local_198.pi_._4_1_ = '\0';
  local_198.pi_._5_1_ = '\0';
  local_198.pi_._6_1_ = '\0';
  local_198.pi_._7_1_ = '\0';
  local_2c8._0_8_ = "merkleBlock.vMatchedTxn.size() == 1";
  local_2c8.m_message.px = (element_type *)0xe69981;
  local_228[8] = 0;
  local_228._0_8_ = &PTR__lazy_ostream_013abc70;
  stack0xfffffffffffffdf0 = (lazy_ostream *)&local_2c8;
  local_218._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_300 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_228,1,0,WARN,_cVar16,
             (size_t)&local_308,0x156);
  boost::detail::shared_count::~shared_count(&local_198);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x158;
  file_01.m_begin = (iterator)&local_318;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_328,
             msg_01);
  local_228._0_8_ = _DAT_00e69190;
  local_228[8] = UNK_00e69198;
  local_228._9_7_ = _UNK_00e69199;
  _local_218 = _DAT_00e691a0;
  auVar11[0] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x10] == DAT_00e691a0);
  auVar11[1] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x11] ==
                DAT_00e691a0._1_1_);
  auVar11[2] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x12] ==
                DAT_00e691a0._2_1_);
  auVar11[3] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x13] ==
                DAT_00e691a0._3_1_);
  auVar11[4] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x14] ==
                DAT_00e691a0._4_1_);
  auVar11[5] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x15] ==
                DAT_00e691a0._5_1_);
  auVar11[6] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x16] ==
                DAT_00e691a0._6_1_);
  auVar11[7] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x17] ==
                DAT_00e691a0._7_1_);
  auVar11[8] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x18] ==
                DAT_00e691a0._8_1_);
  auVar11[9] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x19] ==
                DAT_00e691a0._9_1_);
  auVar11[10] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 DAT_00e691a0._10_1_);
  auVar11[0xb] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  DAT_00e691a0._11_1_);
  auVar11[0xc] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  DAT_00e691a0._12_1_);
  auVar11[0xd] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  DAT_00e691a0._13_1_);
  auVar11[0xe] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  DAT_00e691a0._14_1_);
  auVar11[0xf] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  DAT_00e691a0._15_1_);
  auVar8[0] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0] == DAT_00e69190);
  auVar8[1] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[1] == DAT_00e69190._1_1_);
  auVar8[2] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[2] == DAT_00e69190._2_1_);
  auVar8[3] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[3] == DAT_00e69190._3_1_);
  auVar8[4] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[4] == DAT_00e69190._4_1_);
  auVar8[5] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[5] == DAT_00e69190._5_1_);
  auVar8[6] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[6] == DAT_00e69190._6_1_);
  auVar8[7] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[7] == DAT_00e69190._7_1_);
  auVar8[8] = -((bool)(local_e8->second).super_base_blob<256U>.m_data._M_elems[8] ==
               DAT_00e69190._8_1_);
  auVar8[9] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[9] == DAT_00e69190._9_1_);
  auVar8[10] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[10] == DAT_00e69190._10_1_
                );
  auVar8[0xb] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0xb] ==
                 DAT_00e69190._11_1_);
  auVar8[0xc] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0xc] ==
                 DAT_00e69190._12_1_);
  auVar8[0xd] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0xd] ==
                 DAT_00e69190._13_1_);
  auVar8[0xe] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0xe] ==
                 DAT_00e69190._14_1_);
  auVar8[0xf] = -((local_e8->second).super_base_blob<256U>.m_data._M_elems[0xf] ==
                 DAT_00e69190._15_1_);
  auVar8 = auVar8 & auVar11;
  local_2c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff);
  local_2c8.m_message.px = (element_type *)0x0;
  local_2c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1d;
  local_2a8._1_7_ = 0xe69d;
  local_2a8.m_message.px = (element_type *)0xe69d8d;
  bStack_1a0 = false;
  local_1a8[0] = (class_property<bool>)0x70;
  local_1a8[1] = 0xbc;
  local_1a8[2] = ':';
  local_1a8[3] = '\x01';
  local_1a8[4] = '\0';
  local_1a8[5] = '\0';
  local_1a8[6] = '\0';
  local_1a8[7] = '\0';
  local_198.pi_._0_1_ = '8';
  local_198.pi_._1_1_ = '\x01';
  local_198.pi_._2_1_ = '<';
  local_198.pi_._3_1_ = '\x01';
  local_198.pi_._4_1_ = '\0';
  local_198.pi_._5_1_ = '\0';
  local_198.pi_._6_1_ = '\0';
  local_198.pi_._7_1_ = '\0';
  uStack_190 = (uchar)&local_2a8;
  uStack_18f = (uchar)((ulong)&local_2a8 >> 8);
  uStack_18e = (uchar)((ulong)&local_2a8 >> 0x10);
  uStack_18d = (uchar)((ulong)&local_2a8 >> 0x18);
  uStack_18c = (uchar)((ulong)&local_2a8 >> 0x20);
  uStack_18b = (uchar)((ulong)&local_2a8 >> 0x28);
  uStack_18a = (uchar)((ulong)&local_2a8 >> 0x30);
  uStack_189 = (uchar)((ulong)&local_2a8 >> 0x38);
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_330 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar16,(size_t)&local_338,0x158);
  boost::detail::shared_count::~shared_count(&local_2c8.m_message.pn);
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x159;
  file_02.m_begin = (iterator)&local_348;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_358,
             msg_02);
  local_1a8[0] = (class_property<bool>)(local_e8->first == 0);
  bStack_1a0 = false;
  uStack_19f = '\0';
  uStack_19e = '\0';
  uStack_19d = '\0';
  uStack_19c = '\0';
  uStack_19b = '\0';
  uStack_19a = '\0';
  uStack_199 = '\0';
  local_198.pi_._0_1_ = '\0';
  local_198.pi_._1_1_ = '\0';
  local_198.pi_._2_1_ = '\0';
  local_198.pi_._3_1_ = '\0';
  local_198.pi_._4_1_ = '\0';
  local_198.pi_._5_1_ = '\0';
  local_198.pi_._6_1_ = '\0';
  local_198.pi_._7_1_ = '\0';
  local_2c8._0_8_ = "merkleBlock.vMatchedTxn[0].first == 0";
  local_2c8.m_message.px = (element_type *)0xe69a18;
  local_228[8] = 0;
  local_228._0_8_ = &PTR__lazy_ostream_013abc70;
  stack0xfffffffffffffdf0 = &local_2c8;
  local_218._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_360 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_228,1,0,WARN,_cVar16,
             (size_t)&local_368,0x159);
  boost::detail::shared_count::~shared_count(&local_198);
  local_2a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_2a8._1_7_ = 0;
  local_2a8.m_message.px = (element_type *)0x0;
  local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x15d;
  file_03.m_begin = (iterator)&local_398;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3a8,
             msg_03);
  CPartialMerkleTree::ExtractMatches
            ((uint256 *)local_228,&local_138,(vector<uint256,_std::allocator<uint256>_> *)&local_2a8
             ,&local_388);
  auVar12[0] = -((bool)local_88[4] == local_228[0]);
  auVar12[1] = -(local_88[5] == local_228[1]);
  auVar12[2] = -(local_88[6] == local_228[2]);
  auVar12[3] = -(local_88[7] == local_228[3]);
  auVar12[4] = -(local_88[8] == local_228[4]);
  auVar12[5] = -(local_88[9] == local_228[5]);
  auVar12[6] = -(local_88[10] == local_228[6]);
  auVar12[7] = -(local_88[0xb] == local_228[7]);
  auVar12[8] = -(local_88[0xc] == local_228[8]);
  auVar12[9] = -(local_88[0xd] == local_228[9]);
  auVar12[10] = -(local_88[0xe] == local_228[10]);
  auVar12[0xb] = -(local_88[0xf] == local_228[0xb]);
  auVar12[0xc] = -(local_78[0] == local_228[0xc]);
  auVar12[0xd] = -(local_78[1] == local_228[0xd]);
  auVar12[0xe] = -(local_78[2] == local_228[0xe]);
  auVar12[0xf] = -(local_78[3] == local_228[0xf]);
  auVar14[0] = -(local_78[4] == local_218[0]);
  auVar14[1] = -(local_78[5] == local_218[1]);
  auVar14[2] = -(local_78[6] == local_218[2]);
  auVar14[3] = -(local_78[7] == local_218[3]);
  auVar14[4] = -(local_78[8] == local_218[4]);
  auVar14[5] = -(local_78[9] == local_218[5]);
  auVar14[6] = -(local_78[10] == local_218[6]);
  auVar14[7] = -(local_78[0xb] == local_218[7]);
  auVar14[8] = -(local_78[0xc] == local_218[8]);
  auVar14[9] = -(local_78[0xd] == uStack_20f);
  auVar14[10] = -(local_78[0xe] == uStack_20e);
  auVar14[0xb] = -(local_78[0xf] == uStack_20d);
  auVar14[0xc] = -(local_68[0] == uStack_20c);
  auVar14[0xd] = -(local_68[1] == uStack_20b);
  auVar14[0xe] = -(local_68[2] == uStack_20a);
  auVar14[0xf] = -(local_68[3] == uStack_209);
  auVar12 = auVar12 & auVar14;
  local_2c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff);
  local_2c8.m_message.px = (element_type *)0x0;
  local_2c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_450._0_8_ = "merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot";
  local_450.m_message.px = (element_type *)0xe697dd;
  bStack_1a0 = false;
  local_1a8[0] = (class_property<bool>)0x70;
  local_1a8[1] = 0xbc;
  local_1a8[2] = ':';
  local_1a8[3] = '\x01';
  local_1a8[4] = '\0';
  local_1a8[5] = '\0';
  local_1a8[6] = '\0';
  local_1a8[7] = '\0';
  local_198.pi_._0_1_ = '8';
  local_198.pi_._1_1_ = '\x01';
  local_198.pi_._2_1_ = '<';
  local_198.pi_._3_1_ = '\x01';
  local_198.pi_._4_1_ = '\0';
  local_198.pi_._5_1_ = '\0';
  local_198.pi_._6_1_ = '\0';
  local_198.pi_._7_1_ = '\0';
  uStack_190 = (uchar)&local_450;
  uStack_18f = (uchar)((ulong)&local_450 >> 8);
  uStack_18e = (uchar)((ulong)&local_450 >> 0x10);
  uStack_18d = (uchar)((ulong)&local_450 >> 0x18);
  uStack_18c = (uchar)((ulong)&local_450 >> 0x20);
  uStack_18b = (uchar)((ulong)&local_450 >> 0x28);
  uStack_18a = (uchar)((ulong)&local_450 >> 0x30);
  uStack_189 = (uchar)((ulong)&local_450 >> 0x38);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3b0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar16,(size_t)&local_3b8,0x15d);
  boost::detail::shared_count::~shared_count(&local_2c8.m_message.pn);
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x15e;
  file_04.m_begin = (iterator)&local_3c8;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3d8,
             msg_04);
  local_1a8[0] = (class_property<bool>)
                 ((long)local_2a8.m_message.px -
                  CONCAT71(local_2a8._1_7_,
                           local_2a8.p_predicate_value.super_readonly_property<bool>.
                           super_class_property<bool>.value) >> 5 ==
                 ((long)local_e0 - (long)local_e8 >> 2) * -0x71c71c71c71c71c7);
  bStack_1a0 = false;
  uStack_19f = '\0';
  uStack_19e = '\0';
  uStack_19d = '\0';
  uStack_19c = '\0';
  uStack_19b = '\0';
  uStack_19a = '\0';
  uStack_199 = '\0';
  local_198.pi_._0_1_ = '\0';
  local_198.pi_._1_1_ = '\0';
  local_198.pi_._2_1_ = '\0';
  local_198.pi_._3_1_ = '\0';
  local_198.pi_._4_1_ = '\0';
  local_198.pi_._5_1_ = '\0';
  local_198.pi_._6_1_ = '\0';
  local_198.pi_._7_1_ = '\0';
  local_2c8._0_8_ = "vMatched.size() == merkleBlock.vMatchedTxn.size()";
  local_2c8.m_message.px = (element_type *)0xe6980f;
  local_228[8] = 0;
  local_228._0_8_ = &PTR__lazy_ostream_013abc70;
  stack0xfffffffffffffdf0 = &local_2c8;
  local_218._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3e0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_228,1,0,WARN,_cVar16,
             (size_t)&local_3e8,0x15e);
  boost::detail::shared_count::~shared_count(&local_198);
  if (local_2a8.m_message.px !=
      (element_type *)
      CONCAT71(local_2a8._1_7_,
               local_2a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
               value)) {
    uVar6 = 1;
    uVar7 = 0;
    do {
      local_3f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_3f0 = "";
      local_408 = &boost::unit_test::basic_cstring<char_const>::null;
      local_400 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = (iterator)0x160;
      file_05.m_begin = (iterator)&local_3f8;
      msg_05.m_end = pvVar5;
      msg_05.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_408,
                 msg_05);
      puVar1 = (uchar *)(CONCAT71(local_2a8._1_7_,
                                  local_2a8.p_predicate_value.super_readonly_property<bool>.
                                  super_class_property<bool>.value) + uVar7 * 0x20);
      auVar8 = *(undefined1 (*) [16])
                (CONCAT71(local_2a8._1_7_,
                          local_2a8.p_predicate_value.super_readonly_property<bool>.
                          super_class_property<bool>.value) + 0x10 + uVar7 * 0x20);
      puVar2 = &local_e8[uVar7].second;
      auVar15[0] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0] == *puVar1);
      auVar15[1] = -((puVar2->super_base_blob<256U>).m_data._M_elems[1] == puVar1[1]);
      auVar15[2] = -((puVar2->super_base_blob<256U>).m_data._M_elems[2] == puVar1[2]);
      auVar15[3] = -((puVar2->super_base_blob<256U>).m_data._M_elems[3] == puVar1[3]);
      auVar15[4] = -((puVar2->super_base_blob<256U>).m_data._M_elems[4] == puVar1[4]);
      auVar15[5] = -((puVar2->super_base_blob<256U>).m_data._M_elems[5] == puVar1[5]);
      auVar15[6] = -((puVar2->super_base_blob<256U>).m_data._M_elems[6] == puVar1[6]);
      auVar15[7] = -((puVar2->super_base_blob<256U>).m_data._M_elems[7] == puVar1[7]);
      auVar15[8] = -((puVar2->super_base_blob<256U>).m_data._M_elems[8] == puVar1[8]);
      auVar15[9] = -((puVar2->super_base_blob<256U>).m_data._M_elems[9] == puVar1[9]);
      auVar15[10] = -((puVar2->super_base_blob<256U>).m_data._M_elems[10] == puVar1[10]);
      auVar15[0xb] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xb] == puVar1[0xb]);
      auVar15[0xc] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xc] == puVar1[0xc]);
      auVar15[0xd] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xd] == puVar1[0xd]);
      auVar15[0xe] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xe] == puVar1[0xe]);
      auVar15[0xf] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xf] == puVar1[0xf]);
      puVar1 = local_e8[uVar7].second.super_base_blob<256U>.m_data._M_elems + 0x10;
      auVar9[0] = -(*puVar1 == auVar8[0]);
      auVar9[1] = -(puVar1[1] == auVar8[1]);
      auVar9[2] = -(puVar1[2] == auVar8[2]);
      auVar9[3] = -(puVar1[3] == auVar8[3]);
      auVar9[4] = -(puVar1[4] == auVar8[4]);
      auVar9[5] = -(puVar1[5] == auVar8[5]);
      auVar9[6] = -(puVar1[6] == auVar8[6]);
      auVar9[7] = -(puVar1[7] == auVar8[7]);
      auVar9[8] = -(puVar1[8] == auVar8[8]);
      auVar9[9] = -(puVar1[9] == auVar8[9]);
      auVar9[10] = -(puVar1[10] == auVar8[10]);
      auVar9[0xb] = -(puVar1[0xb] == auVar8[0xb]);
      auVar9[0xc] = -(puVar1[0xc] == auVar8[0xc]);
      auVar9[0xd] = -(puVar1[0xd] == auVar8[0xd]);
      auVar9[0xe] = -(puVar1[0xe] == auVar8[0xe]);
      auVar9[0xf] = -(puVar1[0xf] == auVar8[0xf]);
      auVar9 = auVar9 & auVar15;
      local_1a8[0] = (class_property<bool>)
                     ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff);
      bStack_1a0 = false;
      uStack_19f = '\0';
      uStack_19e = '\0';
      uStack_19d = '\0';
      uStack_19c = '\0';
      uStack_19b = '\0';
      uStack_19a = '\0';
      uStack_199 = '\0';
      local_198.pi_._0_1_ = '\0';
      local_198.pi_._1_1_ = '\0';
      local_198.pi_._2_1_ = '\0';
      local_198.pi_._3_1_ = '\0';
      local_198.pi_._4_1_ = '\0';
      local_198.pi_._5_1_ = '\0';
      local_198.pi_._6_1_ = '\0';
      local_198.pi_._7_1_ = '\0';
      local_2c8._0_8_ = "vMatched[i] == merkleBlock.vMatchedTxn[i].second";
      local_2c8.m_message.px = (element_type *)0xe69840;
      local_228[8] = 0;
      local_228._0_8_ = &PTR__lazy_ostream_013abc70;
      stack0xfffffffffffffdf0 = &local_2c8;
      local_218._0_8_ = boost::unit_test::lazy_ostream::inst;
      local_418 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_410 = "";
      pvVar4 = (iterator)0x1;
      pvVar5 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_228,1,0,WARN,_cVar16,
                 (size_t)&local_418,0x160);
      boost::detail::shared_count::~shared_count(&local_198);
      uVar7 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar7 < (ulong)((long)local_2a8.m_message.px -
                             CONCAT71(local_2a8._1_7_,
                                      local_2a8.p_predicate_value.super_readonly_property<bool>.
                                      super_class_property<bool>.value) >> 5));
  }
  args_3 = &local_144;
  args_4 = &local_140;
  local_198.pi_._0_1_ = '\0';
  local_198.pi_._1_1_ = '\0';
  local_198.pi_._2_1_ = '\0';
  local_198.pi_._3_1_ = '\0';
  local_198.pi_._4_1_ = '\0';
  local_198.pi_._5_1_ = '\0';
  local_198.pi_._6_1_ = '\0';
  local_198.pi_._7_1_ = '\0';
  uStack_190 = '\0';
  uStack_18f = '\0';
  uStack_18e = '\0';
  uStack_18d = '\0';
  uStack_18c = '\0';
  uStack_18b = '\0';
  uStack_18a = '\0';
  uStack_189 = '\0';
  local_1a8[0] = (class_property<bool>)0x0;
  local_1a8[1] = '\0';
  local_1a8[2] = '\0';
  local_1a8[3] = '\0';
  local_1a8[4] = '\0';
  local_1a8[5] = '\0';
  local_1a8[6] = '\0';
  local_1a8[7] = '\0';
  bStack_1a0 = false;
  uStack_19f = '\0';
  uStack_19e = '\0';
  uStack_19d = '\0';
  uStack_19c = '\0';
  uStack_19b = '\0';
  uStack_19a = '\0';
  uStack_199 = '\0';
  SerializeMany<DataStream,int,uint256,uint256,unsigned_int,unsigned_int,unsigned_int>
            ((DataStream *)local_1a8,(int *)local_188,(uint256 *)(local_188 + 4),&local_164,args_3,
             args_4,&local_13c);
  CPartialMerkleTree::SerializationOps<DataStream,CPartialMerkleTree_const,ActionSerialize>
            (&local_138,local_1a8);
  memcpy(local_228,&DAT_00e6a2a4,0x77);
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x166;
  file_06.m_begin = (iterator)&local_428;
  msg_06.m_end = (iterator)args_4;
  msg_06.m_begin = (iterator)args_3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_438,
             msg_06);
  left_end._M_current._1_1_ = uStack_19f;
  left_end._M_current._0_1_ = bStack_1a0;
  left_end._M_current._2_1_ = uStack_19e;
  left_end._M_current._3_1_ = uStack_19d;
  left_end._M_current._4_1_ = uStack_19c;
  left_end._M_current._5_1_ = uStack_19b;
  left_end._M_current._6_1_ = uStack_19a;
  left_end._M_current._7_1_ = uStack_199;
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_450,&local_451,
             (byte *)(CONCAT17(local_1a8[7],
                               CONCAT16(local_1a8[6],
                                        CONCAT15(local_1a8[5],
                                                 CONCAT14(local_1a8[4],
                                                          CONCAT13(local_1a8[3],
                                                                   CONCAT12(local_1a8[2],
                                                                            CONCAT11(local_1a8[1],
                                                                                     local_1a8[0])))
                                                         )))) +
                     CONCAT17(uStack_189,
                              CONCAT16(uStack_18a,
                                       CONCAT15(uStack_18b,
                                                CONCAT14(uStack_18c,
                                                         CONCAT13(uStack_18d,
                                                                  CONCAT12(uStack_18e,
                                                                           CONCAT11(uStack_18f,
                                                                                    uStack_190))))))
                             )),left_end,local_228,local_1b1);
  local_2c8.m_message.px = (element_type *)(local_2c8.m_message._1_8_ << 8);
  local_2c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2b0 = "";
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_460 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_450,(lazy_ostream *)&local_2c8,1,0xd,4,0xe69d8e,(size_t)&local_468,0x166,
             "merkleStream.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_450.m_message.pn);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_1a8);
  if (local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_2a8._1_7_,
                            local_2a8.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_2a8.m_message.pn.pi_ - (long)pvVar3);
  }
  if (local_e8 != (pointer)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  if (local_138.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_138.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_138.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_138.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_138.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_138.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_138.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_138.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_138.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_250.vData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.vData.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_250.vData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.vData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_270);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_block_3_and_serialize)
{
    // Random real block (000000000000dab0130bbcc991d3d7ae6b81aa6f50a798888dfe62337458dc45)
    // With one tx
    CBlock block;
    DataStream stream{
        "0100000079cda856b143d9db2c1caff01d1aecc8630d30625d10e8b4b8b0000000000000b50cc069d6a3e33e3ff84a5c41d9d3febe7c770fdcc96b2c3ff60abe184f196367291b4d4c86041b8fa45d630101000000010000000000000000000000000000000000000000000000000000000000000000ffffffff08044c86041b020a02ffffffff0100f2052a01000000434104ecd3229b0571c3be876feaac0442a9f13c5a572742927af1dc623353ecf8c202225f64868137a18cdd85cbbb4c74fbccfd4f49639cf1bdc94a5672bb15ad5d4cac00000000"_hex,
    };
    stream >> TX_WITH_WITNESS(block);

    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    // Match the only transaction
    filter.insert(uint256{"63194f18be0af63f2c6bc9dc0f777cbefed3d9415c4af83f3ee3a3d669c00cb5"});

    CMerkleBlock merkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 1);

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"63194f18be0af63f2c6bc9dc0f777cbefed3d9415c4af83f3ee3a3d669c00cb5"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 0);

    std::vector<uint256> vMatched;
    std::vector<unsigned int> vIndex;
    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);

    DataStream merkleStream{};
    merkleStream << merkleBlock;

    constexpr auto expected{"0100000079cda856b143d9db2c1caff01d1aecc8630d30625d10e8b4b8b0000000000000b50cc069d6a3e33e3ff84a5c41d9d3febe7c770fdcc96b2c3ff60abe184f196367291b4d4c86041b8fa45d630100000001b50cc069d6a3e33e3ff84a5c41d9d3febe7c770fdcc96b2c3ff60abe184f19630101"_hex};
    BOOST_CHECK_EQUAL_COLLECTIONS(merkleStream.begin(), merkleStream.end(), expected.begin(), expected.end());
}